

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O3

void Qentem::StringUtils::EscapeHTMLSpecialChars<Qentem::StringStream<wchar_t>,wchar_t>
               (StringStream<wchar_t> *stream,wchar_t *str,SizeT length)

{
  wchar_t wVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  wchar_t *from;
  wchar_t *to;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  if (length == 0) {
LAB_0011cddf:
    uVar4 = stream->length_;
    uVar2 = uVar4 + (length - uVar6);
    if (stream->capacity_ < uVar2) {
      StringStream<wchar_t>::expand(stream,uVar2);
      uVar4 = stream->length_;
    }
    Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,(length - uVar6) * 4);
    stream->length_ = uVar2;
    return;
  }
  uVar7 = 0;
LAB_0011ca5e:
  iVar5 = (int)uVar7;
  wVar1 = str[uVar7];
  if (wVar1 < L'\'') {
    if (wVar1 == L'\"') {
      uVar4 = stream->length_;
      uVar2 = uVar4 + (iVar5 - uVar6);
      if (stream->capacity_ < uVar2) {
        StringStream<wchar_t>::expand(stream,uVar2);
        uVar4 = stream->length_;
      }
      Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,(iVar5 - uVar6) * 4);
      stream->length_ = uVar2;
      uVar4 = uVar2 + 6;
      if (stream->capacity_ < uVar4) {
        StringStream<wchar_t>::expand(stream,uVar4);
        uVar2 = stream->length_;
      }
      to = stream->storage_ + uVar2;
      from = L"&quot;";
      goto LAB_0011cc8a;
    }
    if (wVar1 != L'&') {
LAB_0011ccac:
      uVar7 = (ulong)(iVar5 + 1);
      goto LAB_0011cc9d;
    }
    uVar2 = length - iVar5;
    if (uVar2 < 6) {
LAB_0011cce0:
      if (uVar2 < 5) {
LAB_0011cd14:
        if (3 < uVar2) goto LAB_0011cd19;
LAB_0011cd6e:
        uVar4 = stream->length_;
        uVar2 = uVar4 + (iVar5 - uVar6);
        if (stream->capacity_ < uVar2) {
          StringStream<wchar_t>::expand(stream,uVar2);
          uVar4 = stream->length_;
        }
        Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,(iVar5 - uVar6) * 4);
        stream->length_ = uVar2;
        uVar4 = uVar2 + 5;
        if (stream->capacity_ < uVar4) {
          StringStream<wchar_t>::expand(stream,uVar4);
          uVar2 = stream->length_;
        }
        to = stream->storage_ + uVar2;
        from = L"&amp;";
        uVar6 = 0x14;
        goto LAB_0011cc8f;
      }
LAB_0011cce5:
      if (str[uVar7 + 4] == L';') {
        lVar3 = 0;
        do {
          if (*(int *)((long)str + lVar3 + uVar7 * 4) !=
              *(int *)((long)L"&amp;&amp;&amp;&amp;&amp;" + lVar3 + 0x50)) {
            if (lVar3 != 0x10) goto LAB_0011cd14;
            break;
          }
          lVar3 = lVar3 + 4;
        } while (lVar3 != 0x10);
        uVar7 = (ulong)(iVar5 + 5);
        goto LAB_0011cc9d;
      }
LAB_0011cd19:
      if (str[uVar7 + 3] != L';') goto LAB_0011cd6e;
      lVar3 = 0;
      do {
        if (*(int *)((long)str + lVar3 + uVar7 * 4) !=
            *(int *)((long)L"&lt;&lt;&lt;&lt;&lt;" + lVar3 + 0x40)) {
          if (lVar3 != 0xc) {
            lVar3 = 0;
            goto LAB_0011cd44;
          }
          break;
        }
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0xc);
      goto LAB_0011cd65;
    }
    if (str[uVar7 + 5] != L';') goto LAB_0011cce5;
    lVar3 = 0;
    do {
      if (*(int *)((long)str + lVar3 + uVar7 * 4) !=
          *(int *)((long)L"&lt;&gt;&amp;&apos;&quot;" + lVar3 + 0x4c)) {
        if (lVar3 != 0x14) {
          lVar3 = 0;
          goto LAB_0011ccb9;
        }
        break;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x14);
    goto LAB_0011ccda;
  }
  if (wVar1 == L'\'') {
    uVar4 = stream->length_;
    uVar2 = uVar4 + (iVar5 - uVar6);
    if (stream->capacity_ < uVar2) {
      StringStream<wchar_t>::expand(stream,uVar2);
      uVar4 = stream->length_;
    }
    Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,(iVar5 - uVar6) * 4);
    stream->length_ = uVar2;
    uVar4 = uVar2 + 6;
    if (stream->capacity_ < uVar4) {
      StringStream<wchar_t>::expand(stream,uVar4);
      uVar2 = stream->length_;
    }
    to = stream->storage_ + uVar2;
    from = L"&apos;";
LAB_0011cc8a:
    uVar6 = 0x18;
  }
  else {
    if (wVar1 == L'<') {
      uVar4 = stream->length_;
      uVar2 = uVar4 + (iVar5 - uVar6);
      if (stream->capacity_ < uVar2) {
        StringStream<wchar_t>::expand(stream,uVar2);
        uVar4 = stream->length_;
      }
      Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,(iVar5 - uVar6) * 4);
      stream->length_ = uVar2;
      uVar4 = uVar2 + 4;
      if (stream->capacity_ < uVar4) {
        StringStream<wchar_t>::expand(stream,uVar4);
        uVar2 = stream->length_;
      }
      to = stream->storage_ + uVar2;
      from = L"&lt;";
    }
    else {
      if (wVar1 != L'>') goto LAB_0011ccac;
      uVar4 = stream->length_;
      uVar2 = uVar4 + (iVar5 - uVar6);
      if (stream->capacity_ < uVar2) {
        StringStream<wchar_t>::expand(stream,uVar2);
        uVar4 = stream->length_;
      }
      Memory::Copy<unsigned_int>(stream->storage_ + uVar4,str + uVar6,(iVar5 - uVar6) * 4);
      stream->length_ = uVar2;
      uVar4 = uVar2 + 4;
      if (stream->capacity_ < uVar4) {
        StringStream<wchar_t>::expand(stream,uVar4);
        uVar2 = stream->length_;
      }
      to = stream->storage_ + uVar2;
      from = L"&gt;";
    }
    uVar6 = 0x10;
  }
LAB_0011cc8f:
  Memory::Copy<unsigned_int>(to,from,uVar6);
  uVar6 = iVar5 + 1;
  uVar7 = (ulong)uVar6;
  stream->length_ = uVar4;
  goto LAB_0011cc9d;
  while (lVar3 = lVar3 + 4, lVar3 != 0x14) {
LAB_0011ccb9:
    if (*(int *)((long)str + lVar3 + uVar7 * 4) !=
        *(int *)((long)L" &lt; &lt; &gt; &gt; &amp; &amp; &quot; &quot; &apos; &apos;" +
                lVar3 + 0xd8)) {
      if (lVar3 != 0x14) goto LAB_0011cce0;
      break;
    }
  }
LAB_0011ccda:
  uVar7 = (ulong)(iVar5 + 6);
LAB_0011cc9d:
  if (length <= (uint)uVar7) goto LAB_0011cddf;
  goto LAB_0011ca5e;
  while (lVar3 = lVar3 + 4, lVar3 != 0xc) {
LAB_0011cd44:
    if (*(int *)((long)str + lVar3 + uVar7 * 4) != *(int *)((long)L"&lt;&amp;&gt;" + lVar3 + 0x24))
    {
      if (lVar3 != 0xc) goto LAB_0011cd6e;
      break;
    }
  }
LAB_0011cd65:
  uVar7 = (ulong)(iVar5 + 4);
  goto LAB_0011cc9d;
}

Assistant:

static void EscapeHTMLSpecialChars(StringStream_T &stream, const Char_T *str, SizeT length) {
    using HTMLSpecialChars = HTMLSpecialChars_T<Char_T, sizeof(Char_T)>;

    if (Config::AutoEscapeHTML) {
        SizeT offset = 0;
        SizeT index  = 0;

        while (index < length) {
            switch (str[index]) {
                case '&': {
                    const SizeT   rem_length = (length - index);
                    const Char_T *n_str      = (str + index);

                    if ((rem_length > SizeT{5}) && (n_str[SizeT{5}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLQuote, SizeT{5}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLSingleQuote, SizeT{5})) {
                            index += SizeT{6};
                            break;
                        }
                    }

                    if ((rem_length > SizeT{4}) && (n_str[SizeT{4}] == HTMLSpecialChars::SemicolonChar) &&
                        StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLAnd, SizeT{4})) {
                        index += SizeT{5};
                        break;
                    }

                    if ((rem_length > SizeT{3}) && (n_str[SizeT{3}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLLess, SizeT{3}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLGreater, SizeT{3})) {
                            index += SizeT{4};
                            break;
                        }
                    }

                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLAnd, HTMLSpecialChars::HTMLAndLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '<': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLLess, HTMLSpecialChars::HTMLLessLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '>': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLGreater, HTMLSpecialChars::HTMLGreaterLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '"': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLQuote, HTMLSpecialChars::HTMLQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '\'': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLSingleQuote, HTMLSpecialChars::HTMLSingleQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                default: {
                    ++index;
                }
            }
        }

        stream.Write((str + offset), (length - offset));
    } else {
        stream.Write(str, length);
    }
}